

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint zlib_compress(uchar **out,size_t *outsize,uchar *in,size_t insize,
                  LodePNGCompressSettings *settings)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uchar *puVar4;
  size_t sVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  size_t sStack_40;
  uchar *puStack_38;
  
  if (settings->custom_zlib ==
      (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0) {
    puStack_38 = (uchar *)0x0;
    sStack_40 = 0;
    if (settings->custom_deflate ==
        (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0) {
      uVar3 = lodepng_deflate(&puStack_38,&sStack_40,in,insize,settings);
    }
    else {
      uVar1 = (*settings->custom_deflate)(&puStack_38,&sStack_40,in,insize,settings);
      uVar3 = 0x6f;
      if (uVar1 == 0) {
        uVar3 = 0;
      }
    }
    *out = (uchar *)0x0;
    *outsize = 0;
    if (uVar3 == 0) {
      *outsize = sStack_40 + 6;
      puVar4 = (uchar *)malloc(sStack_40 + 6);
      *out = puVar4;
      uVar3 = 0;
      if (puVar4 == (uchar *)0x0) {
        uVar3 = 0x53;
      }
    }
    if (uVar3 == 0) {
      if ((int)insize == 0) {
        uVar1 = 1;
      }
      else {
        uVar1 = 1;
        uVar2 = 0;
        do {
          uVar9 = (uint)insize;
          uVar6 = 0x15b0;
          if (uVar9 < 0x15b0) {
            uVar6 = uVar9;
          }
          uVar7 = uVar9;
          if (0x15af < (insize & 0xffffffff)) {
            uVar7 = 0x15b0;
          }
          lVar8 = 0;
          do {
            uVar1 = uVar1 + in[lVar8];
            uVar2 = uVar2 + uVar1;
            lVar8 = lVar8 + 1;
          } while (uVar7 != (uint)lVar8);
          uVar1 = uVar1 % 0xfff1;
          uVar2 = uVar2 % 0xfff1;
          in = in + (ulong)(uVar6 - 1) + 1;
          insize = (size_t)(uVar9 - uVar6);
        } while (uVar9 - uVar6 != 0);
        uVar1 = uVar2 << 0x10 | uVar1;
      }
      **out = 'x';
      (*out)[1] = '\x01';
      if (sStack_40 != 0) {
        sVar5 = 0;
        do {
          (*out)[sVar5 + 2] = puStack_38[sVar5];
          sVar5 = sVar5 + 1;
        } while (sVar5 != sStack_40);
      }
      *(uint *)(*out + (*outsize - 4)) =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    }
    free(puStack_38);
    return uVar3;
  }
  uVar3 = (*settings->custom_zlib)(out,outsize,in,insize,settings);
  if (uVar3 != 0) {
    uVar3 = 0x6f;
  }
  return uVar3;
}

Assistant:

static unsigned zlib_compress(unsigned char** out, size_t* outsize, const unsigned char* in,
                              size_t insize, const LodePNGCompressSettings* settings) {
  if(settings->custom_zlib) {
    unsigned error = settings->custom_zlib(out, outsize, in, insize, settings);
    /*the custom zlib is allowed to have its own error codes, however, we translate it to code 111*/
    return error ? 111 : 0;
  } else {
    return lodepng_zlib_compress(out, outsize, in, insize, settings);
  }
}